

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O2

vec4f * __thiscall
GouraudShader::vertex
          (vec4f *__return_storage_ptr__,GouraudShader *this,Model *model,int iface,int nthvert)

{
  double dVar1;
  double *pdVar2;
  size_t nthvert_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vec4f gl_Vertex;
  vec<4UL,_double> local_f8;
  vec<4UL,_double> local_d0;
  mat<4UL,_4UL> local_b0;
  
  nthvert_00 = (size_t)nthvert;
  Model::vert((vec3f *)&local_b0,model,(long)iface,nthvert_00);
  embed<4ul,3ul,double>(&local_f8,(vec3f *)&local_b0,1.0);
  operator*(&local_b0,&(this->super_IShader).uniform_Projection,
            &(this->super_IShader).uniform_ModelView);
  operator*(&local_d0,&local_b0,&local_f8);
  local_f8.data[2] = local_d0.data[2];
  local_f8.data[3] = local_d0.data[3];
  local_f8.data[0] = local_d0.data[0];
  local_f8.data[1] = local_d0.data[1];
  operator/(local_b0.rows,&local_f8,local_f8.data + 3);
  proj<3ul,4ul,double>((vec<3UL,_double> *)&local_d0,local_b0.rows);
  mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,(vec<3UL,_double> *)&local_d0);
  Model::normal((vec3f *)&local_b0,model,(long)iface,nthvert_00);
  dVar1 = dot<3ul,double>((vec3f *)&local_b0,&this->uniform_light_dir);
  uVar5 = 0;
  uVar6 = 0;
  if (0.0 <= dVar1) {
    uVar5 = SUB84(dVar1,0);
    uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  uVar3 = 0;
  uVar4 = 0x3ff00000;
  if ((double)CONCAT44(uVar6,uVar5) <= 1.0) {
    uVar3 = uVar5;
    uVar4 = uVar6;
  }
  pdVar2 = vec<3UL,_double>::operator[](&this->varying_ity,nthvert_00);
  *pdVar2 = (double)CONCAT44(uVar4,uVar3);
  operator*(local_b0.rows,&(this->super_IShader).uniform_Viewport,&local_f8);
  local_f8.data[2] = local_b0.rows[0].data[2];
  local_f8.data[3] = local_b0.rows[0].data[3];
  local_f8.data[0] = local_b0.rows[0].data[0];
  local_f8.data[1] = local_b0.rows[0].data[1];
  operator/(local_b0.rows,&local_f8,local_f8.data + 3);
  proj<4ul,4ul,double>(__return_storage_ptr__,local_b0.rows);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));
        gl_Vertex = uniform_Projection * uniform_ModelView * gl_Vertex;
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));

        varying_ity[nthvert] = clamp(dot(model.normal(iface, nthvert), uniform_light_dir), 0., 1.);

        gl_Vertex = uniform_Viewport * gl_Vertex;
        return proj<4>(gl_Vertex / gl_Vertex[3]);
    }